

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

int __thiscall helics::ConnectorFederateManager::getTranslatorCount(ConnectorFederateManager *this)

{
  size_t sVar1;
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_RDI;
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  local_20;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(in_RDI);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator->(&local_20);
  sVar1 = gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::size
                    ((StringMappedVector<helics::Translator,_(reference_stability)0,_5> *)0x334a86);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
              *)0x334aa0);
  return (int)sVar1;
}

Assistant:

int ConnectorFederateManager::getTranslatorCount() const
{
    return static_cast<int>(translators.lock_shared()->size());
}